

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetAngleResolution(ON_Annotation *this,ON_DimStyle *parent_style,int resolution)

{
  int iVar1;
  ON_DimStyle *pOVar2;
  ON_DimStyle *override_style;
  bool bCreate;
  int resolution_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  iVar1 = ON_DimStyle::AngleResolution(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,resolution != iVar1);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetAngleResolution(pOVar2,resolution);
    ON_DimStyle::SetFieldOverride(pOVar2,AngleResolution,resolution != iVar1);
  }
  return;
}

Assistant:

void ON_Annotation::SetAngleResolution(const ON_DimStyle* parent_style, int resolution)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (resolution != parent_style->AngleResolution());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetAngleResolution(resolution);
    override_style->SetFieldOverride(ON_DimStyle::field::AngleResolution, bCreate);
  }
}